

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O1

QModelIndex * __thiscall
QtPrivate::QCalendarView::moveCursor
          (QModelIndex *__return_storage_ptr__,QCalendarView *this,CursorAction cursorAction,
          KeyboardModifiers modifiers)

{
  undefined4 uVar1;
  long lVar2;
  QCalendarModel *this_00;
  undefined8 uVar3;
  long in_FS_OFFSET;
  QDate currentDate;
  QCalendar cal;
  undefined1 *local_80;
  undefined8 local_78;
  undefined1 *puStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  YearMonthDay local_60;
  undefined1 local_51;
  undefined1 *local_50;
  undefined1 local_48 [16];
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QAbstractItemView::model((QAbstractItemView *)this);
  lVar2 = QMetaObject::cast((QObject *)&QCalendarModel::staticMetaObject);
  if (lVar2 == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QTableView::moveCursor(__return_storage_ptr__,&this->super_QTableView,cursorAction,modifiers);
      return __return_storage_ptr__;
    }
    goto LAB_003cfe5e;
  }
  local_60._0_8_ = *(undefined8 *)(lVar2 + 0x18);
  if (this->readOnly == true) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QAbstractItemView::currentIndex(__return_storage_ptr__,(QAbstractItemView *)this);
      return __return_storage_ptr__;
    }
    goto LAB_003cfe5e;
  }
  local_68.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::currentIndex((QModelIndex *)&local_78,(QAbstractItemView *)this);
  local_80 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = (QCalendarModel *)QAbstractItemView::model((QAbstractItemView *)this);
  local_80 = (undefined1 *)QCalendarModel::dateForCell(this_00,(int)local_78,local_78._4_4_);
  switch(cursorAction) {
  case MoveUp:
    break;
  case MoveDown:
    break;
  case MoveLeft:
    QWidget::layoutDirection((QWidget *)this);
    break;
  case MoveRight:
    QWidget::layoutDirection((QWidget *)this);
    break;
  case MoveHome:
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_4_ = 0xaaaaaaaa;
    local_48._0_8_ = QCalendar::partsFromDate((QDate)&local_60);
    local_48._8_4_ = 1;
    goto LAB_003cfdc6;
  case MoveEnd:
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_4_ = 0xaaaaaaaa;
    local_48._0_12_ = QCalendar::partsFromDate((QDate)&local_60);
    uVar1 = QCalendar::daysInMonth((int)&local_60,local_48._4_4_);
    local_48._8_4_ = uVar1;
LAB_003cfdc6:
    local_80 = (undefined1 *)QCalendar::dateFromParts(&local_60);
    goto switchD_003cfcb6_default;
  case MovePageUp:
    uVar3 = 0xffffffff;
    goto LAB_003cfde4;
  case MovePageDown:
    uVar3 = 1;
LAB_003cfde4:
    local_80 = (undefined1 *)QDate::addMonths(&local_80,uVar3,local_60._0_8_);
    goto switchD_003cfcb6_default;
  case MoveNext:
  case MovePrevious:
    goto switchD_003cfcb6_caseD_8;
  default:
    goto switchD_003cfcb6_default;
  }
  local_80 = (undefined1 *)QDate::addDays((longlong)&local_80);
switchD_003cfcb6_default:
  local_48._8_8_ = &local_50;
  local_50 = local_80;
  local_38 = &local_51;
  local_51 = 1;
  local_48._0_8_ = (void *)0x0;
  QMetaObject::activate((QObject *)this,&staticMetaObject,1,(void **)local_48);
switchD_003cfcb6_caseD_8:
  QAbstractItemView::currentIndex(__return_storage_ptr__,(QAbstractItemView *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
LAB_003cfe5e:
  __stack_chk_fail();
}

Assistant:

QModelIndex QCalendarView::moveCursor(CursorAction cursorAction, Qt::KeyboardModifiers modifiers)
{
    QCalendarModel *calendarModel = qobject_cast<QCalendarModel *>(model());
    if (!calendarModel)
        return QTableView::moveCursor(cursorAction, modifiers);

    QCalendar cal = calendarModel->calendar();

    if (readOnly)
        return currentIndex();

    QModelIndex index = currentIndex();
    QDate currentDate = static_cast<QCalendarModel*>(model())->dateForCell(index.row(), index.column());
    switch (cursorAction) {
        case QAbstractItemView::MoveUp:
            currentDate = currentDate.addDays(-7);
            break;
        case QAbstractItemView::MoveDown:
            currentDate = currentDate.addDays(7);
            break;
        case QAbstractItemView::MoveLeft:
            currentDate = currentDate.addDays(isRightToLeft() ? 1 : -1);
            break;
        case QAbstractItemView::MoveRight:
            currentDate = currentDate.addDays(isRightToLeft() ? -1 : 1);
            break;
        case QAbstractItemView::MoveHome: {
            auto parts = cal.partsFromDate(currentDate);
            if (parts.isValid()) {
                parts.day = 1;
                currentDate = cal.dateFromParts(parts);
            }
        }
            break;
        case QAbstractItemView::MoveEnd: {
            auto parts = cal.partsFromDate(currentDate);
            if (parts.isValid()) {
                parts.day = cal.daysInMonth(parts.month, parts.year);
                currentDate = cal.dateFromParts(parts);
            }
        }
            break;
        case QAbstractItemView::MovePageUp:
            currentDate = currentDate.addMonths(-1, cal);
            break;
        case QAbstractItemView::MovePageDown:
            currentDate = currentDate.addMonths(1, cal);
            break;
        case QAbstractItemView::MoveNext:
        case QAbstractItemView::MovePrevious:
            return currentIndex();
        default:
            break;
    }
    emit changeDate(currentDate, true);
    return currentIndex();
}